

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  bool bVar1;
  byte bVar2;
  string *in_RDI;
  Message *in_stack_00000a20;
  ParserImpl *in_stack_00000a28;
  string *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  byte local_9a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [48];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  while( true ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,">",&local_41);
    bVar1 = LookingAt((ParserImpl *)
                      CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                      in_stack_ffffffffffffff48);
    local_9a = 0;
    bVar2 = local_9a;
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"}",&local_79);
      in_stack_ffffffffffffff57 =
           LookingAt((ParserImpl *)
                     CONCAT17(in_stack_ffffffffffffff57,
                              CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                     in_stack_ffffffffffffff48);
      bVar2 = in_stack_ffffffffffffff57 ^ 0xff;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    in_stack_ffffffffffffff56 = bVar2;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if ((in_stack_ffffffffffffff56 & 1) == 0) break;
    bVar1 = ConsumeField(in_stack_00000a28,in_stack_00000a20);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = Consume((ParserImpl *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI
                 );
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool ConsumeMessage(Message* message, const std::string delimiter) {
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }